

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int spacePush(xmlParserCtxtPtr ctxt,int val)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  
  iVar1 = ctxt->spaceMax;
  if (iVar1 <= ctxt->spaceNr) {
    ctxt->spaceMax = iVar1 * 2;
    piVar2 = (int *)(*xmlRealloc)(ctxt->spaceTab,(long)iVar1 << 3);
    if (piVar2 == (int *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      piVar3 = (int *)(ulong)(uint)ctxt->spaceMax;
      ctxt->spaceMax = ctxt->spaceMax / 2;
    }
    else {
      ctxt->spaceTab = piVar2;
      piVar3 = piVar2;
    }
    if (piVar2 == (int *)0x0) {
      return (int)piVar3;
    }
  }
  piVar2 = ctxt->spaceTab;
  piVar2[ctxt->spaceNr] = val;
  ctxt->space = piVar2 + ctxt->spaceNr;
  iVar1 = ctxt->spaceNr + 1;
  ctxt->spaceNr = iVar1;
  return iVar1;
}

Assistant:

static int spacePush(xmlParserCtxtPtr ctxt, int val) {
    if (ctxt->spaceNr >= ctxt->spaceMax) {
        int *tmp;

	ctxt->spaceMax *= 2;
        tmp = (int *) xmlRealloc(ctxt->spaceTab,
	                         ctxt->spaceMax * sizeof(ctxt->spaceTab[0]));
        if (tmp == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    ctxt->spaceMax /=2;
	    return(-1);
	}
	ctxt->spaceTab = tmp;
    }
    ctxt->spaceTab[ctxt->spaceNr] = val;
    ctxt->space = &ctxt->spaceTab[ctxt->spaceNr];
    return(ctxt->spaceNr++);
}